

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int ecdh_compute_shared_restartable
              (mbedtls_ecp_group *grp,mbedtls_mpi *z,mbedtls_ecp_point *Q,mbedtls_mpi *d,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,mbedtls_ecp_restart_ctx *rs_ctx
              )

{
  int iVar1;
  undefined1 local_70 [8];
  mbedtls_ecp_point P;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_mpi *d_local;
  mbedtls_ecp_point *Q_local;
  mbedtls_mpi *z_local;
  mbedtls_ecp_group *grp_local;
  
  P.Z._12_4_ = 0xffffff92;
  mbedtls_ecp_point_init((mbedtls_ecp_point *)local_70);
  P.Z._12_4_ = mbedtls_ecp_mul_restartable(grp,(mbedtls_ecp_point *)local_70,d,Q,f_rng,p_rng,rs_ctx)
  ;
  if (P.Z._12_4_ == 0) {
    iVar1 = mbedtls_ecp_is_zero((mbedtls_ecp_point *)local_70);
    if (iVar1 == 0) {
      P.Z._12_4_ = mbedtls_mpi_copy(z,(mbedtls_mpi *)local_70);
    }
    else {
      P.Z._12_4_ = 0xffffb080;
    }
  }
  mbedtls_ecp_point_free((mbedtls_ecp_point *)local_70);
  return P.Z._12_4_;
}

Assistant:

static int ecdh_compute_shared_restartable(mbedtls_ecp_group *grp,
                                           mbedtls_mpi *z,
                                           const mbedtls_ecp_point *Q, const mbedtls_mpi *d,
                                           int (*f_rng)(void *, unsigned char *, size_t),
                                           void *p_rng,
                                           mbedtls_ecp_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_point P;

    mbedtls_ecp_point_init(&P);

    MBEDTLS_MPI_CHK(mbedtls_ecp_mul_restartable(grp, &P, d, Q,
                                                f_rng, p_rng, rs_ctx));

    if (mbedtls_ecp_is_zero(&P)) {
        ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(z, &P.X));

cleanup:
    mbedtls_ecp_point_free(&P);

    return ret;
}